

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::SetTimestampUnit(RTPSession *this,double u)

{
  int iVar1;
  
  if (this->created == true) {
    if ((this->rtcpbuilder).init == true) {
      if (0.0 <= u) {
        (this->rtcpbuilder).timestampunit = u;
        return 0;
      }
      iVar1 = -0x31;
    }
    else {
      iVar1 = -0x32;
    }
  }
  else {
    iVar1 = -0x3e;
  }
  return iVar1;
}

Assistant:

int RTPSession::SetTimestampUnit(double u)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = rtcpbuilder.SetTimestampUnit(u);
	BUILDER_UNLOCK
	return status;
}